

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_util.cpp
# Opt level: O1

bool __thiscall Kumu::Timestamp::Archive(Timestamp *this,MemIOWriter *Writer)

{
  uint uVar1;
  uint uVar2;
  ui32_t uVar3;
  uint uVar4;
  caltime ct;
  caltime local_24;
  
  if (Writer == (MemIOWriter *)0x0) {
    __assert_fail("Writer",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_util.cpp"
                  ,0x3ed,"virtual bool Kumu::Timestamp::Archive(MemIOWriter *) const");
  }
  TAI::caltime::operator=(&local_24,&this->m_Timestamp);
  if ((ulong)Writer->m_size + 2 <= (ulong)Writer->m_capacity) {
    *(ushort *)(Writer->m_p + Writer->m_size) =
         (ushort)local_24.date.year << 8 | (ushort)local_24.date.year >> 8;
    uVar3 = Writer->m_size;
    uVar1 = uVar3 + 2;
    Writer->m_size = uVar1;
    if (uVar3 + 3 <= Writer->m_capacity) {
      Writer->m_p[uVar1] = (byte_t)local_24.date.month;
      uVar3 = Writer->m_size;
      uVar1 = uVar3 + 1;
      Writer->m_size = uVar1;
      if (uVar3 + 2 <= Writer->m_capacity) {
        Writer->m_p[uVar1] = (byte_t)local_24.date.day;
        uVar3 = Writer->m_size;
        uVar1 = uVar3 + 1;
        Writer->m_size = uVar1;
        if (uVar3 + 2 <= Writer->m_capacity) {
          Writer->m_p[uVar1] = (byte_t)local_24.hour;
          uVar3 = Writer->m_size;
          uVar1 = uVar3 + 1;
          Writer->m_size = uVar1;
          if (uVar3 + 2 <= Writer->m_capacity) {
            Writer->m_p[uVar1] = (byte_t)local_24.minute;
            uVar3 = Writer->m_size;
            uVar1 = uVar3 + 1;
            Writer->m_size = uVar1;
            if (uVar3 + 2 <= Writer->m_capacity) {
              Writer->m_p[uVar1] = (byte_t)local_24.second;
              uVar3 = Writer->m_size;
              uVar1 = uVar3 + 1;
              Writer->m_size = uVar1;
              uVar4 = uVar3 + 2;
              uVar2 = Writer->m_capacity;
              if (uVar2 < uVar4) {
                return uVar4 <= uVar2;
              }
              Writer->m_p[uVar1] = '\0';
              Writer->m_size = Writer->m_size + 1;
              return uVar4 <= uVar2;
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool
Kumu::Timestamp::Archive(MemIOWriter* Writer) const
{
  assert(Writer);

  ui16_t year;
  ui8_t month, day, hour, minute, second, tick = 0;
  GetComponents(year, month, day, hour, minute, second);

  if ( ! Writer->WriteUi16BE(year) ) return false;	
  if ( ! Writer->WriteUi8(month) ) return false;
  if ( ! Writer->WriteUi8(day) ) return false;
  if ( ! Writer->WriteUi8(hour) ) return false;
  if ( ! Writer->WriteUi8(minute) ) return false;
  if ( ! Writer->WriteUi8(second) ) return false;
  if ( ! Writer->WriteUi8(tick) ) return false;
  return true;
}